

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkPutOnTop(Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtk2)

{
  Abc_Ntk_t *pNtk_00;
  char *pcVar1;
  Abc_Obj_t *pAVar2;
  Vec_Ptr_t *pVVar3;
  Abc_Obj_t *pAVar4;
  long lVar5;
  int iVar6;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcStrash.c"
                  ,0x31d,"Abc_Ntk_t *Abc_NtkPutOnTop(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtk2->ntkType == ABC_NTK_LOGIC) {
    if (pNtk->vPos->nSize == pNtk2->vPis->nSize) {
      Abc_NtkCleanCopy(pNtk);
      Abc_NtkCleanCopy(pNtk2);
      pNtk_00 = Abc_NtkAlloc(pNtk->ntkType,pNtk->ntkFunc,1);
      pcVar1 = Extra_UtilStrsav(pNtk->pName);
      pNtk_00->pName = pcVar1;
      pcVar1 = Extra_UtilStrsav(pNtk->pSpec);
      pNtk_00->pSpec = pcVar1;
      for (iVar6 = 0; iVar6 < pNtk->vPis->nSize; iVar6 = iVar6 + 1) {
        pAVar2 = Abc_NtkPi(pNtk,iVar6);
        Abc_NtkDupObj(pNtk_00,pAVar2,1);
      }
      pVVar3 = Abc_NtkDfs(pNtk,0);
      for (iVar6 = 0; iVar6 < pVVar3->nSize; iVar6 = iVar6 + 1) {
        pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(pVVar3,iVar6);
        Abc_NtkDupObj(pNtk_00,pAVar2,0);
        for (lVar5 = 0; lVar5 < (pAVar2->vFanins).nSize; lVar5 = lVar5 + 1) {
          Abc_ObjAddFanin((pAVar2->field_6).pCopy,
                          *(Abc_Obj_t **)
                           ((long)pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanins).pArray[lVar5]] +
                           0x40));
        }
      }
      Vec_PtrFree(pVVar3);
      for (iVar6 = 0; iVar6 < pNtk2->vPis->nSize; iVar6 = iVar6 + 1) {
        pAVar2 = Abc_NtkPi(pNtk2,iVar6);
        pAVar4 = Abc_NtkPo(pNtk,iVar6);
        pAVar4 = Abc_ObjChild0Copy(pAVar4);
        (pAVar2->field_6).pCopy = pAVar4;
      }
      pVVar3 = Abc_NtkDfs(pNtk2,0);
      for (iVar6 = 0; iVar6 < pVVar3->nSize; iVar6 = iVar6 + 1) {
        pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(pVVar3,iVar6);
        Abc_NtkDupObj(pNtk_00,pAVar2,0);
        for (lVar5 = 0; lVar5 < (pAVar2->vFanins).nSize; lVar5 = lVar5 + 1) {
          Abc_ObjAddFanin((pAVar2->field_6).pCopy,
                          *(Abc_Obj_t **)
                           ((long)pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanins).pArray[lVar5]] +
                           0x40));
        }
      }
      Vec_PtrFree(pVVar3);
      for (iVar6 = 0; iVar6 < pNtk2->vPos->nSize; iVar6 = iVar6 + 1) {
        pAVar4 = Abc_NtkPo(pNtk2,iVar6);
        Abc_NtkDupObj(pNtk_00,pAVar4,1);
        pAVar2 = (pAVar4->field_6).pCopy;
        pAVar4 = Abc_ObjChild0Copy(pAVar4);
        Abc_ObjAddFanin(pAVar2,pAVar4);
      }
      iVar6 = Abc_NtkCheck(pNtk_00);
      if (iVar6 == 0) {
        fwrite("Abc_NtkPutOnTop(): Network check has failed.\n",0x2d,1,_stdout);
      }
      return pNtk_00;
    }
    __assert_fail("Abc_NtkPoNum(pNtk) == Abc_NtkPiNum(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcStrash.c"
                  ,799,"Abc_Ntk_t *Abc_NtkPutOnTop(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  __assert_fail("Abc_NtkIsLogic(pNtk2)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcStrash.c"
                ,0x31e,"Abc_Ntk_t *Abc_NtkPutOnTop(Abc_Ntk_t *, Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkPutOnTop( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtk2 )
{
    Vec_Ptr_t * vNodes;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    assert( Abc_NtkIsLogic(pNtk) );
    assert( Abc_NtkIsLogic(pNtk2) );
    assert( Abc_NtkPoNum(pNtk) == Abc_NtkPiNum(pNtk2) );
    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );
    Abc_NtkCleanCopy( pNtk2 );
    // duplicate the name and the spec
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    // clone CIs/CIs/boxes
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 1 );
    // add internal nodes
    vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
    }
    Vec_PtrFree( vNodes );
    // transfer to the POs
    Abc_NtkForEachPi( pNtk2, pObj, i )
        pObj->pCopy = Abc_ObjChild0Copy( Abc_NtkPo(pNtk, i) );
    // add internal nodes
    vNodes = Abc_NtkDfs( pNtk2, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
    }
    Vec_PtrFree( vNodes );
    // clone CIs/CIs/boxes
    Abc_NtkForEachPo( pNtk2, pObj, i )
    {
        Abc_NtkDupObj( pNtkNew, pObj, 1 );
        Abc_ObjAddFanin( pObj->pCopy, Abc_ObjChild0Copy(pObj) );
    }
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkPutOnTop(): Network check has failed.\n" );
    return pNtkNew;
}